

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_gen.c
# Opt level: O0

void free_oprnd(dill_stream c,iogen_oprnd oprnd)

{
  void *in_RDI;
  undefined4 in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000028;
  
  switch(in_stack_0000000c) {
  case 0:
    break;
  case 1:
  case 6:
  case 7:
    switch(in_stack_00000010) {
    case 1:
      ffs_putreg(in_RDI,in_stack_00000028,0);
      break;
    case 2:
      ffs_putreg(in_RDI,in_stack_00000028,2);
      break;
    case 4:
      ffs_putreg(in_RDI,in_stack_00000028,4);
      break;
    case 8:
      ffs_putreg(in_RDI,in_stack_00000028,6);
    }
    break;
  case 2:
  case 4:
    switch(in_stack_00000010) {
    case 1:
      ffs_putreg(in_RDI,in_stack_00000028,1);
      break;
    case 2:
      ffs_putreg(in_RDI,in_stack_00000028,3);
      break;
    case 4:
      ffs_putreg(in_RDI,in_stack_00000028,5);
      break;
    case 8:
      ffs_putreg(in_RDI,in_stack_00000028,7);
    }
    break;
  case 3:
    if (in_stack_00000010 == 4) {
      ffs_putreg(in_RDI,in_stack_00000028,9);
    }
    else if (in_stack_00000010 == 8) {
      ffs_putreg(in_RDI,in_stack_00000028,10);
    }
    break;
  case 5:
  }
  return;
}

Assistant:

void
free_oprnd(dill_stream c, iogen_oprnd oprnd)
{
    REG_DEBUG(("put %d in free\n", _vrr(oprnd.vc_reg)));
    switch (oprnd.data_type) {
    case unknown_type:
	assert(FALSE);
	break;
    case integer_type:
    case boolean_type:
    case enumeration_type:
	switch (oprnd.size) {
	case 1:		/* sizeof char */
	    ffs_putreg(c, oprnd.vc_reg, DILL_C);
	    break;
	case 2:		/* sizeof short */
	    ffs_putreg(c, oprnd.vc_reg, DILL_S);
	    break;
	case 4:		/* sizeof int */
	    ffs_putreg(c, oprnd.vc_reg, DILL_I);
	    break;
#if SIZEOF_SIZE_T != 4
	case SIZEOF_SIZE_T:
	    ffs_putreg(c, oprnd.vc_reg, DILL_L);
	    break;
#else
	case 8:
	    /* simulate with double reg */
	    ffs_putreg(c, oprnd.vc_reg, DILL_I);
	    ffs_putreg(c, oprnd.vc_reg2, DILL_I);
	    REG_DEBUG(("put %d in free\n", _vrr(oprnd.vc_reg2)));
	    break;
#endif
	}
	break;
    case unsigned_type:
    case char_type:
	switch (oprnd.size) {
	case 1:		/* sizeof char */
	    ffs_putreg(c, oprnd.vc_reg, DILL_UC);
	    break;
	case 2:		/* sizeof short */
	    ffs_putreg(c, oprnd.vc_reg, DILL_US);
	    break;
	case 4:		/* sizeof int */
	    ffs_putreg(c, oprnd.vc_reg, DILL_U);
	    break;
#if SIZEOF_SIZE_T != 4
	case SIZEOF_SIZE_T:
	    ffs_putreg(c, oprnd.vc_reg, DILL_UL);
	    break;
#else
	case 8:
	    /* simulate with double reg */
	    ffs_putreg(c, oprnd.vc_reg, DILL_U);
	    ffs_putreg(c, oprnd.vc_reg2, DILL_U);
	    /* vc_reg2 holds high value */
	    REG_DEBUG(("put %d in free\n", _vrr(oprnd.vc_reg2)));
	    break;
#endif
	}
	break;
    case float_type:
	switch (oprnd.size) {
	case SIZEOF_FLOAT:	/* sizeof char */
	    ffs_putreg(c, oprnd.vc_reg, DILL_F);
	    break;
	case SIZEOF_DOUBLE:	/* sizeof short */
	    ffs_putreg(c, oprnd.vc_reg, DILL_D);
	    break;
	}
	break;
    case string_type:
	break;
    }
}